

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int ordinal_index(int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = n % 10;
  iVar1 = 3;
  iVar2 = iVar3 + -1 + (uint)(9 < n) * 4;
  if (3 < iVar3) {
    iVar2 = iVar1;
  }
  if (iVar3 == 0) {
    iVar2 = iVar1;
  }
  if (n - 0xbU < 9) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int ordinal_index(int n)
{
    /* get the last digit */
    int lastdig = n % 10;

    /* 
     *   if it's in the teens, or the last digit is 0 or 4-9, use the generic
     *   Nth suffix 
     */
    if (lastdig == 0 || lastdig >= 4 || (n > 10 && n < 20))
        return 3;

    /* if it's in the 1-3 range, use 1st/2nd/3rd; otherwise use X1st/etc */
    return lastdig + (n < 10 ? -1 : 3);
}